

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParameterTests.cpp
# Opt level: O1

int testBeta2OutOfAllowedRange(void)

{
  bool bVar1;
  NeuralNetwork *nn;
  ostream *poVar2;
  Result res;
  Model m;
  Result local_60;
  Model local_38;
  
  CoreML::Specification::Model::Model(&local_38);
  nn = buildBasicUpdatableNeuralNetworkModel(&local_38);
  addBeta2(nn,kAdamOptimizer,5.0,0.10000000149011612,1.0);
  CoreML::Model::validate(&local_60,&local_38);
  bVar1 = CoreML::Result::good(&local_60);
  if (bVar1) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/ParameterTests.cpp"
               ,0x6e);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x16b);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,": error: ",9);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"!((res).good())",0xf);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," was false, expected true.",0x1a);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60.m_message._M_dataplus._M_p != &local_60.m_message.field_2) {
    operator_delete(local_60.m_message._M_dataplus._M_p,
                    local_60.m_message.field_2._M_allocated_capacity + 1);
  }
  CoreML::Specification::Model::~Model(&local_38);
  return (uint)bVar1;
}

Assistant:

int testBeta2OutOfAllowedRange() {
    
    Specification::Model m;
    
    // basic neural network model without any updatable model parameters.
    auto nn = buildBasicUpdatableNeuralNetworkModel(m);
    
    addBeta2(nn, Specification::Optimizer::kAdamOptimizer, 5.0f, 0.1f, 1.0f);
    
    Result res = Model::validate(m);
    ML_ASSERT_BAD(res);
    return 0;
}